

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

void cmsys::SystemTools::ConvertToUnixSlashes(string *path)

{
  bool bVar1;
  ulong uVar2;
  undefined1 *puVar3;
  char *pcVar4;
  passwd *ppVar5;
  long lVar6;
  size_t size;
  passwd *pw;
  string user;
  size_type idx;
  undefined1 local_50 [8];
  string homeEnv;
  size_type pos;
  char *pos0;
  bool hasDoubleSlash;
  char *pathCString;
  string *path_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pos = std::__cxx11::string::c_str();
    bVar1 = false;
    homeEnv.field_2._8_8_ = 0;
    for (; *(char *)pos != '\0'; pos = pos + 1) {
      if (*(char *)pos == '\\') {
        puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)path);
        *puVar3 = 0x2f;
      }
      if (((!bVar1) && (*(char *)(pos + 1) == '/')) && (*(char *)(pos + 2) == '/')) {
        bVar1 = true;
      }
      homeEnv.field_2._8_8_ = homeEnv.field_2._8_8_ + 1;
    }
    if (bVar1) {
      ReplaceString(path,"//","/");
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    if ((*pcVar4 == '~') && ((pcVar4[1] == '/' || (pcVar4[1] == '\0')))) {
      std::__cxx11::string::string((string *)local_50);
      bVar1 = GetEnv("HOME",(string *)local_50);
      if (bVar1) {
        std::__cxx11::string::replace((ulong)path,0,(string *)0x1);
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    else if (*pcVar4 == '~') {
      user.field_2._8_8_ = std::__cxx11::string::find_first_of((char *)path,0x11925d);
      std::__cxx11::string::substr((ulong)&pw,(ulong)path);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      ppVar5 = getpwnam(pcVar4);
      if (ppVar5 != (passwd *)0x0) {
        std::__cxx11::string::replace((ulong)path,0,(char *)user.field_2._8_8_);
      }
      std::__cxx11::string::~string((string *)&pw);
    }
    lVar6 = std::__cxx11::string::c_str();
    uVar2 = std::__cxx11::string::size();
    if (((1 < uVar2) && (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == '/')) &&
       ((uVar2 != 3 || (*(char *)(lVar6 + 1) != ':')))) {
      std::__cxx11::string::resize((ulong)path);
    }
  }
  return;
}

Assistant:

void SystemTools::ConvertToUnixSlashes(std::string& path)
{
  if (path.empty()) {
    return;
  }

  const char* pathCString = path.c_str();
  bool hasDoubleSlash = false;
#ifdef __VMS
  ConvertVMSToUnix(path);
#else
  const char* pos0 = pathCString;
  for (std::string::size_type pos = 0; *pos0; ++pos) {
    if (*pos0 == '\\') {
      path[pos] = '/';
    }

    // Also, reuse the loop to check for slash followed by another slash
    if (!hasDoubleSlash && *(pos0 + 1) == '/' && *(pos0 + 2) == '/') {
#  ifdef _WIN32
      // However, on windows if the first characters are both slashes,
      // then keep them that way, so that network paths can be handled.
      if (pos > 0) {
        hasDoubleSlash = true;
      }
#  else
      hasDoubleSlash = true;
#  endif
    }

    pos0++;
  }

  if (hasDoubleSlash) {
    SystemTools::ReplaceString(path, "//", "/");
  }
#endif

  // remove any trailing slash
  // if there is a tilda ~ then replace it with HOME
  pathCString = path.c_str();
  if (pathCString[0] == '~' &&
      (pathCString[1] == '/' || pathCString[1] == '\0')) {
    std::string homeEnv;
    if (SystemTools::GetEnv("HOME", homeEnv)) {
      path.replace(0, 1, homeEnv);
    }
  }
#ifdef HAVE_GETPWNAM
  else if (pathCString[0] == '~') {
    std::string::size_type idx = path.find_first_of("/\0");
    std::string user = path.substr(1, idx - 1);
    passwd* pw = getpwnam(user.c_str());
    if (pw) {
      path.replace(0, idx, pw->pw_dir);
    }
  }
#endif
  // remove trailing slash if the path is more than
  // a single /
  pathCString = path.c_str();
  size_t size = path.size();
  if (size > 1 && path.back() == '/') {
    // if it is c:/ then do not remove the trailing slash
    if (!((size == 3 && pathCString[1] == ':'))) {
      path.resize(size - 1);
    }
  }
}